

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O3

void __thiscall Game::setTeams(Game *this)

{
  Team *this_00;
  Team *this_01;
  string local_60;
  string local_40;
  
  this_00 = (Team *)operator_new(0x58);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Team 1","");
  Team::Team(this_00,&local_40,(this->_players)._M_elems[0],(this->_players)._M_elems[2]);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  this_01 = (Team *)operator_new(0x58);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Team 2","");
  Team::Team(this_01,&local_60,(this->_players)._M_elems[1],(this->_players)._M_elems[3]);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  (this->_teams)._M_elems[0] = this_00;
  (this->_teams)._M_elems[1] = this_01;
  return;
}

Assistant:

void Game::setTeams() {
    Team *team1 = new Team("Team 1", _players[0], _players[2]);
    Team *team2 = new Team("Team 2", _players[1], _players[3]);
    _teams = {team1, team2};
}